

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dacload.c
# Opt level: O1

int envy_bios_parse_dacload(envy_bios *bios)

{
  byte bVar1;
  ushort uVar2;
  int iVar3;
  int iVar4;
  envy_bios_dacload_entry *peVar5;
  uint uVar6;
  long lVar7;
  int iVar8;
  char *__format;
  ulong uVar9;
  int iVar10;
  
  uVar2 = (bios->dacload).offset;
  iVar10 = 0;
  if (uVar2 != 0) {
    if ((uint)uVar2 < bios->length) {
      (bios->dacload).version = bios->data[(uint)uVar2];
      iVar10 = 0;
    }
    else {
      (bios->dacload).version = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
      iVar10 = -0xe;
    }
    lVar7 = (ulong)(bios->dacload).offset + 1;
    if ((uint)lVar7 < bios->length) {
      (bios->dacload).hlen = bios->data[lVar7];
      iVar8 = 0;
    }
    else {
      (bios->dacload).hlen = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
      iVar8 = -0xe;
    }
    lVar7 = (ulong)(bios->dacload).offset + 2;
    if ((uint)lVar7 < bios->length) {
      (bios->dacload).rlen = bios->data[lVar7];
      iVar3 = 0;
    }
    else {
      (bios->dacload).rlen = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
      iVar3 = -0xe;
    }
    lVar7 = (ulong)(bios->dacload).offset + 3;
    if ((uint)lVar7 < bios->length) {
      (bios->dacload).entriesnum = bios->data[lVar7];
      iVar4 = 0;
    }
    else {
      (bios->dacload).entriesnum = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
      iVar4 = -0xe;
    }
    if (((iVar8 == 0 && iVar10 == 0) && iVar3 == 0) && iVar4 == 0) {
      envy_bios_block(bios,(uint)(bios->dacload).offset,
                      (uint)(bios->dacload).entriesnum * (uint)(bios->dacload).rlen +
                      (uint)(bios->dacload).hlen,"DACLOAD",-1);
      if (((bios->dacload).version & 0xef) == 0) {
        bVar1 = (bios->dacload).hlen;
        uVar9 = (ulong)bVar1;
        if (bVar1 < 4) {
          __format = "DACLOAD table header too short [%d < %d]\n";
        }
        else {
          uVar6 = (uint)(bios->dacload).rlen;
          if (3 < uVar6) {
            if (bVar1 != 4) {
              fprintf(_stderr,"DACLOAD table header longer than expected [%d > %d]\n",uVar9,4);
            }
            bVar1 = (bios->dacload).rlen;
            if (4 < bVar1) {
              fprintf(_stderr,"DACLOAD table record longer than expected [%d > %d]\n",(ulong)bVar1,4
                     );
            }
            peVar5 = (envy_bios_dacload_entry *)calloc((ulong)(bios->dacload).entriesnum,8);
            (bios->dacload).entries = peVar5;
            if (peVar5 == (envy_bios_dacload_entry *)0x0) {
              return -0xc;
            }
            if ((bios->dacload).entriesnum != '\0') {
              uVar9 = 0;
              do {
                peVar5 = (bios->dacload).entries;
                uVar6 = (uint)(bios->dacload).rlen * (int)uVar9 +
                        (uint)(bios->dacload).hlen + (uint)(bios->dacload).offset;
                peVar5[uVar9].offset = (uint16_t)uVar6;
                uVar6 = uVar6 & 0xffff;
                if (bios->length <= uVar6 + 3) {
                  peVar5[uVar9].val = 0;
                  fprintf(_stderr,"requested OOB u32 at 0x%04x\n");
                  goto LAB_00254705;
                }
                peVar5[uVar9].val = *(uint32_t *)(bios->data + uVar6);
                uVar9 = uVar9 + 1;
              } while (uVar9 < (bios->dacload).entriesnum);
            }
            (bios->dacload).valid = '\x01';
            return 0;
          }
          __format = "DACLOAD table record too short [%d < %d]\n";
          uVar9 = (ulong)uVar6;
        }
        fprintf(_stderr,__format,uVar9,4);
      }
      else {
        envy_bios_parse_dacload_cold_1();
      }
      iVar10 = -0x16;
    }
    else {
LAB_00254705:
      iVar10 = -0xe;
    }
  }
  return iVar10;
}

Assistant:

int envy_bios_parse_dacload (struct envy_bios *bios) {
	struct envy_bios_dacload *dacload = &bios->dacload;
	if (!dacload->offset)
		return 0;
	int err = 0;
	err |= bios_u8(bios, dacload->offset, &dacload->version);
	err |= bios_u8(bios, dacload->offset+1, &dacload->hlen);
	err |= bios_u8(bios, dacload->offset+2, &dacload->rlen);
	err |= bios_u8(bios, dacload->offset+3, &dacload->entriesnum);
	if (err)
		return -EFAULT;
	envy_bios_block(bios, dacload->offset, dacload->hlen + dacload->rlen * dacload->entriesnum, "DACLOAD", -1);
	int wanthlen = 0;
	int wantrlen = 0;
	switch (dacload->version) {
		case 0x00:
		case 0x10:
			wanthlen = 4;
			wantrlen = 4;
			break;
		default:
			ENVY_BIOS_ERR("Unknown DACLOAD table version %d.%d\n", dacload->version >> 4, dacload->version & 0xf);
			return -EINVAL;
	}
	if (dacload->hlen < wanthlen) {
		ENVY_BIOS_ERR("DACLOAD table header too short [%d < %d]\n", dacload->hlen, wanthlen);
		return -EINVAL;
	}
	if (dacload->rlen < wantrlen) {
		ENVY_BIOS_ERR("DACLOAD table record too short [%d < %d]\n", dacload->rlen, wantrlen);
		return -EINVAL;
	}
	if (dacload->hlen > wanthlen) {
		ENVY_BIOS_WARN("DACLOAD table header longer than expected [%d > %d]\n", dacload->hlen, wanthlen);
	}
	if (dacload->rlen > wantrlen) {
		ENVY_BIOS_WARN("DACLOAD table record longer than expected [%d > %d]\n", dacload->rlen, wantrlen);
	}
	dacload->entries = calloc(dacload->entriesnum, sizeof *dacload->entries);
	if (!dacload->entries)
		return -ENOMEM;
	int i;
	for (i = 0; i < dacload->entriesnum; i++) {
		struct envy_bios_dacload_entry *entry = &dacload->entries[i];
		entry->offset = dacload->offset + dacload->hlen + dacload->rlen * i;
		err |= bios_u32(bios, entry->offset, &entry->val);
		if (err)
			return -EFAULT;
	}
	dacload->valid = 1;
	return 0;
}